

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

void pstore::command_line::details::report_unknown_option<std::ostream>
               (string *program_name,string *arg_name,
               maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *value,basic_ostream<char,_std::char_traits<char>_> *errs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool local_4a;
  allocator local_49;
  string local_48 [32];
  basic_ostream<char,_std::char_traits<char>_> *local_28;
  basic_ostream<char,_std::char_traits<char>_> *errs_local;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *value_local;
  string *arg_name_local;
  string *program_name_local;
  
  local_28 = errs;
  errs_local = (basic_ostream<char,_std::char_traits<char>_> *)value;
  value_local = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 *)arg_name;
  arg_name_local = program_name;
  local_4a = pstore::maybe::operator_cast_to_bool((maybe *)value);
  if (local_4a) {
    pbVar1 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator*((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)errs_local);
    std::__cxx11::string::string(local_48,(string *)pbVar1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"",&local_49);
  }
  local_4a = !local_4a;
  report_unknown_option<std::ostream>(program_name,arg_name,(string *)local_48,local_28);
  std::__cxx11::string::~string(local_48);
  if (local_4a) {
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return;
}

Assistant:

void report_unknown_option (std::string const & program_name,
                                        std::string const & arg_name,
                                        maybe<std::string> const & value, ErrorStream & errs) {
                report_unknown_option (program_name, arg_name, value ? *value : "", errs);
            }